

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

RegexPattern * __thiscall Js::FunctionBody::GetLiteralRegexWithLock(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *pvVar5;
  
  uVar3 = GetCountField(this,LiteralRegexCount);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19af,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar2) goto LAB_007798f3;
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,LiteralRegexes);
  if (pvVar5 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b0,"(this->GetLiteralRegexesWithLock())",
                                "this->GetLiteralRegexesWithLock()");
    if (!bVar2) {
LAB_007798f3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,LiteralRegexes);
  return *(RegexPattern **)((long)pvVar5 + (ulong)index * 8);
}

Assistant:

UnifiedRegex::RegexPattern *FunctionBody::GetLiteralRegexWithLock(const uint index)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexesWithLock());

        return this->GetLiteralRegexesWithLock()[index];
    }